

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

event_item * decode_action(CManager_conflict cm,event_item *event,response_cache_element *act)

{
  void *pvVar1;
  int iVar2;
  __pid_t _Var3;
  pthread_t pVar4;
  event_item *peVar5;
  CMbuffer p_Var6;
  attr_list p_Var7;
  long in_RDX;
  event_item *in_RSI;
  CManager_conflict in_RDI;
  ssize_t in_stack_00000030;
  CManager_conflict in_stack_00000038;
  timespec ts_2;
  void *decode_buffer_2;
  CMbuffer cm_decode_buf_1;
  event_item *new_event;
  size_t decoded_length_1;
  timespec ts_1;
  timespec ts;
  void *decode_buffer_1;
  CMbuffer cm_decode_buf;
  size_t decoded_length;
  void *decode_buffer;
  event_path_data evp;
  event_path_data in_stack_ffffffffffffff30;
  FILE *pFVar8;
  void *in_stack_ffffffffffffff48;
  CManager_conflict in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff68;
  CMTraceType in_stack_ffffffffffffff6c;
  CManager in_stack_ffffffffffffff70;
  timespec local_68;
  timespec local_58;
  void *local_48;
  CMbuffer local_40;
  undefined8 local_38;
  void *local_30;
  _event_path_data *local_28;
  long local_20;
  event_item *local_18;
  CManager_conflict local_10;
  event_item *local_8;
  
  local_28 = in_RDI->evp;
  if (in_RSI->event_encoded == 0) {
    local_8 = in_RSI;
    if (in_RSI->reference_format != *(FMFormat *)(in_RDX + 0x20)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                    ,0x4e1,
                    "event_item *decode_action(CManager, event_item *, response_cache_element *)");
    }
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    if (in_RSI->contents < Event_CM_Owned) {
      local_10 = in_RDI;
      FFS_est_decode_length(*(undefined8 *)(in_RDX + 0x28),in_RSI->encoded_event,in_RSI->event_len);
      peVar5 = get_free_event(in_stack_ffffffffffffff30);
      p_Var6 = cm_get_data_buf(in_stack_00000038,in_stack_00000030);
      pvVar1 = p_Var6->buffer;
      iVar2 = CMtrace_val[9];
      if (local_18->cm->CMTrace_file == (FILE *)0x0) {
        iVar2 = CMtrace_init(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      }
      if (iVar2 != 0) {
        if (CMtrace_PID != 0) {
          pFVar8 = (FILE *)local_18->cm->CMTrace_file;
          _Var3 = getpid();
          pVar4 = pthread_self();
          fprintf(pFVar8,"P%lxT%lx - ",(long)_Var3,pVar4);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&stack0xffffffffffffff68);
          fprintf((FILE *)local_18->cm->CMTrace_file,"%lld.%.9ld - ",
                  CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                  in_stack_ffffffffffffff70);
        }
        fprintf((FILE *)local_18->cm->CMTrace_file,
                "Last cm_get_data_buf was for EVPath decode buffer2, return was %p\n",p_Var6);
      }
      fflush((FILE *)local_18->cm->CMTrace_file);
      if (local_18->event_len == -1) {
        printf("BAD LENGTH\n");
      }
      FFSdecode_to_buffer(*(undefined8 *)(local_20 + 0x28),local_18->encoded_event,pvVar1);
      peVar5->decoded_event = pvVar1;
      peVar5->event_encoded = 0;
      peVar5->encoded_event = (void *)0x0;
      peVar5->event_len = 0;
      peVar5->encoded_eventv = (FFSEncodeVector)0x0;
      peVar5->cm = local_10;
      peVar5->reference_format = *(FMFormat *)(local_20 + 0x20);
      peVar5->contents = Event_CM_Owned;
      if (local_18->attrs == (attr_list)0x0) {
        peVar5->attrs = (attr_list)0x0;
      }
      else {
        p_Var7 = (attr_list)attr_copy_list(local_18->attrs);
        peVar5->attrs = p_Var7;
      }
      return_event((event_path_data)in_stack_ffffffffffffff70,
                   (event_item *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      local_8 = peVar5;
    }
    else if (in_RSI->contents == Event_CM_Owned) {
      iVar2 = FFSdecode_in_place_possible(*(undefined8 *)(in_RDX + 0x18));
      if (iVar2 == 0) {
        local_38 = FFS_est_decode_length
                             (*(undefined8 *)(local_20 + 0x28),local_18->encoded_event,
                              local_18->event_len);
        local_40 = cm_get_data_buf(in_stack_00000038,in_stack_00000030);
        local_48 = local_40->buffer;
        iVar2 = CMtrace_val[9];
        if (local_18->cm->CMTrace_file == (FILE *)0x0) {
          iVar2 = CMtrace_init(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        }
        if (iVar2 != 0) {
          if (CMtrace_PID != 0) {
            in_stack_ffffffffffffff50 = (CManager_conflict)local_18->cm->CMTrace_file;
            _Var3 = getpid();
            pVar4 = pthread_self();
            fprintf((FILE *)in_stack_ffffffffffffff50,"P%lxT%lx - ",(long)_Var3,pVar4);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_58);
            fprintf((FILE *)local_18->cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,
                    local_58.tv_nsec);
          }
          fprintf((FILE *)local_18->cm->CMTrace_file,
                  "Last cm_get_data_buf was for EVPath decode buffer, return was %p\n",local_40);
        }
        fflush((FILE *)local_18->cm->CMTrace_file);
        if (local_18->event_len == -1) {
          printf("BAD LENGTH\n");
        }
        FFSdecode_to_buffer(*(undefined8 *)(local_20 + 0x28),local_18->encoded_event,local_48);
        local_18->decoded_event = local_48;
        local_18->event_encoded = 0;
        iVar2 = CMtrace_val[9];
        if (local_18->cm->CMTrace_file == (FILE *)0x0) {
          iVar2 = CMtrace_init(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        }
        if (iVar2 != 0) {
          if (CMtrace_PID != 0) {
            pFVar8 = (FILE *)local_18->cm->CMTrace_file;
            _Var3 = getpid();
            in_stack_ffffffffffffff48 = (void *)(long)_Var3;
            pVar4 = pthread_self();
            fprintf(pFVar8,"P%lxT%lx - ",in_stack_ffffffffffffff48,pVar4);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_68);
            fprintf((FILE *)local_18->cm->CMTrace_file,"%lld.%.9ld - ",local_68.tv_sec,
                    local_68.tv_nsec);
          }
          fprintf((FILE *)local_18->cm->CMTrace_file,"EVPath now returning original, data is %p\n",
                  local_18->encoded_event);
        }
        fflush((FILE *)local_18->cm->CMTrace_file);
        INT_CMreturn_buffer(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        local_18->encoded_event = (void *)0x0;
        local_18->reference_format = *(FMFormat *)(local_20 + 0x20);
        local_8 = local_18;
      }
      else {
        iVar2 = FFSdecode_in_place(*(undefined8 *)(local_20 + 0x28),local_18->encoded_event,
                                   &local_30);
        if (iVar2 == 0) {
          printf("Decode failed\n");
          local_8 = (event_item *)0x0;
        }
        else {
          local_18->decoded_event = local_30;
          local_18->encoded_event = (void *)0x0;
          local_18->event_encoded = 0;
          local_18->reference_format = *(FMFormat *)(local_20 + 0x20);
          local_8 = local_18;
        }
      }
    }
    else {
      local_8 = (event_item *)0x0;
    }
  }
  return local_8;
}

Assistant:

static event_item *
decode_action(CManager cm, event_item *event, response_cache_element *act)
{
    event_path_data evp = cm->evp;
    if (!event->event_encoded) {
	if (event->reference_format == act->o.decode.target_reference_format) {
	    return event;
	}
	assert(0);
    }
	
    switch(event->contents) {
    case Event_CM_Owned:
	if (FFSdecode_in_place_possible(act->o.decode.decode_format)) {
	    void *decode_buffer;
	    if (!FFSdecode_in_place(act->o.decode.context,
				    event->encoded_event, 
				    (void**) (intptr_t) &decode_buffer)) {
		printf("Decode failed\n");
		return 0;
	    }
	    event->decoded_event = decode_buffer;
	    event->encoded_event = NULL;
	    event->event_encoded = 0;
	    event->reference_format = act->o.decode.target_reference_format;
	    return event;
	} else {
	    size_t decoded_length = FFS_est_decode_length(act->o.decode.context, 
						       event->encoded_event,
						       event->event_len);
	    CMbuffer cm_decode_buf = cm_get_data_buf(cm, decoded_length);
	    void *decode_buffer = cm_decode_buf->buffer;
	    CMtrace_out(event->cm, CMBufferVerbose, "Last cm_get_data_buf was for EVPath decode buffer, return was %p\n", cm_decode_buf);
	    if (event->event_len == -1) printf("BAD LENGTH\n");
	    FFSdecode_to_buffer(act->o.decode.context, event->encoded_event, 
				decode_buffer);
	    event->decoded_event = decode_buffer;
	    event->event_encoded = 0;
	    CMtrace_out(event->cm, CMBufferVerbose, "EVPath now returning original, data is %p\n", event->encoded_event);
	    INT_CMreturn_buffer(cm, event->encoded_event);
	    event->encoded_event = NULL;
	    event->reference_format = act->o.decode.target_reference_format;
	    return event;
	}
    case Event_Freeable:
    case Event_App_Owned:
    {
	/* can't do anything with the old event, make a new one */
	size_t decoded_length = FFS_est_decode_length(act->o.decode.context, 
						   event->encoded_event,
						   event->event_len);
	event_item *new_event = get_free_event(evp);
	CMbuffer cm_decode_buf = cm_get_data_buf(cm, decoded_length);
	void *decode_buffer = cm_decode_buf->buffer;
	CMtrace_out(event->cm, CMBufferVerbose, "Last cm_get_data_buf was for EVPath decode buffer2, return was %p\n", cm_decode_buf);
	if (event->event_len == -1) printf("BAD LENGTH\n");
	FFSdecode_to_buffer(act->o.decode.context, 
			    event->encoded_event, decode_buffer);
	new_event->decoded_event = decode_buffer;
	new_event->event_encoded = 0;
	new_event->encoded_event = NULL;
	new_event->event_len = 0;
	new_event->encoded_eventv = NULL;
	new_event->cm = cm;
	new_event->reference_format = act->o.decode.target_reference_format;
	new_event->contents = Event_CM_Owned;
	if (event->attrs) {
	    new_event->attrs = attr_copy_list(event->attrs);
	} else {
	    new_event->attrs = NULL;
	}
	/* new event will take the place of old event */
	return_event(evp, event);
	return new_event;
    }
    }
    return NULL;   /* shouldn't ever happen */
}